

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharScanner.hpp
# Opt level: O1

void __thiscall antlr::CharScanner::consume(CharScanner *this)

{
  int *piVar1;
  InputBuffer *pIVar2;
  int iVar3;
  int iVar4;
  
  if (((this->inputState).ref)->ptr->guessing == 0) {
    iVar3 = (*(this->super_TokenStream)._vptr_TokenStream[3])(this,1);
    iVar4 = iVar3;
    if (this->caseSensitive == false) {
      pIVar2 = ((this->inputState).ref)->ptr->input;
      iVar4 = (*pIVar2->_vptr_InputBuffer[6])(pIVar2,1);
    }
    (*(this->super_TokenStream)._vptr_TokenStream[4])(this,(ulong)(uint)(int)(char)iVar4);
    if (iVar3 == 9) {
      (*(this->super_TokenStream)._vptr_TokenStream[0x23])(this);
    }
    else {
      piVar1 = &((this->inputState).ref)->ptr->column;
      *piVar1 = *piVar1 + 1;
    }
  }
  (*((this->inputState).ref)->ptr->input->_vptr_InputBuffer[3])();
  return;
}

Assistant:

virtual void consume()
	{
		if (inputState->guessing == 0)
		{
			int c = LA(1);
			if (caseSensitive)
			{
				append(c);
			}
			else
			{
				// use input.LA(), not LA(), to get original case
				// CharScanner.LA() would toLower it.
				append(inputState->getInput().LA(1));
			}

			// RK: in a sense I don't like this automatic handling.
			if (c == '\t')
				tab();
			else
				inputState->column++;
		}
		inputState->getInput().consume();
	}